

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_bit_reverse.c
# Opt level: O2

void WebRtcSpl_ComplexBitReverse(int16_t *complex_data,int stages)

{
  short sVar1;
  undefined4 uVar2;
  int iVar3;
  int16_t *piVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  
  if (stages - 7U < 2) {
    piVar4 = index_7;
    if (stages == 8) {
      piVar4 = index_8;
    }
    for (uVar6 = 0; uVar6 < ((ulong)(stages == 8) << 7 | 0x70); uVar6 = uVar6 + 2) {
      uVar2 = *(undefined4 *)(complex_data + (long)piVar4[uVar6] * 2);
      sVar1 = piVar4[uVar6 + 1];
      *(undefined4 *)(complex_data + (long)piVar4[uVar6] * 2) =
           *(undefined4 *)(complex_data + (long)sVar1 * 2);
      *(undefined4 *)(complex_data + (long)sVar1 * 2) = uVar2;
    }
  }
  else {
    iVar3 = 1 << ((byte)stages & 0x1f);
    uVar5 = 0;
    for (lVar7 = 1; lVar7 < iVar3; lVar7 = lVar7 + 1) {
      iVar8 = iVar3;
      do {
        iVar8 = iVar8 >> 1;
      } while ((int)(~uVar5 + iVar3) < iVar8);
      uVar5 = (uVar5 & iVar8 - 1U) + iVar8;
      lVar9 = (long)(int)uVar5;
      if (lVar7 < lVar9) {
        uVar2 = *(undefined4 *)(complex_data + lVar7 * 2);
        *(undefined4 *)(complex_data + lVar7 * 2) = *(undefined4 *)(complex_data + lVar9 * 2);
        *(undefined4 *)(complex_data + lVar9 * 2) = uVar2;
      }
    }
  }
  return;
}

Assistant:

void WebRtcSpl_ComplexBitReverse(int16_t* __restrict complex_data, int stages) {
  /* For any specific value of stages, we know exactly the indexes that are
   * bit reversed. Currently (Feb. 2012) in WebRTC the only possible values of
   * stages are 7 and 8, so we use tables to save unnecessary iterations and
   * calculations for these two cases.
   */
  if (stages == 7 || stages == 8) {
    int m = 0;
    int length = 112;
    const int16_t* index = index_7;

    if (stages == 8) {
      length = 240;
      index = index_8;
    }

    /* Decimation in time. Swap the elements with bit-reversed indexes. */
    for (m = 0; m < length; m += 2) {
      /* We declare a int32_t* type pointer, to load both the 16-bit real
       * and imaginary elements from complex_data in one instruction, reducing
       * complexity.
       */
      int32_t* complex_data_ptr = (int32_t*)complex_data;
      int32_t temp = 0;

      temp = complex_data_ptr[index[m]];  /* Real and imaginary */
      complex_data_ptr[index[m]] = complex_data_ptr[index[m + 1]];
      complex_data_ptr[index[m + 1]] = temp;
    }
  }
  else {
    int m = 0, mr = 0, l = 0;
    int n = 1 << stages;
    int nn = n - 1;

    /* Decimation in time - re-order data */
    for (m = 1; m <= nn; ++m) {
      int32_t* complex_data_ptr = (int32_t*)complex_data;
      int32_t temp = 0;

      /* Find out indexes that are bit-reversed. */
      l = n;
      do {
        l >>= 1;
      } while (l > nn - mr);
      mr = (mr & (l - 1)) + l;

      if (mr <= m) {
        continue;
      }

      /* Swap the elements with bit-reversed indexes.
       * This is similar to the loop in the stages == 7 or 8 cases.
       */
      temp = complex_data_ptr[m];  /* Real and imaginary */
      complex_data_ptr[m] = complex_data_ptr[mr];
      complex_data_ptr[mr] = temp;
    }
  }
}